

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<tinyusdz::Reference> *value)

{
  bool bVar1;
  Reference v;
  Reference local_170;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::Reference>::reset(value);
    bVar1 = true;
  }
  else {
    Reference::Reference(&local_170);
    bVar1 = ReadBasicType(this,&local_170);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::Reference>::operator=(value,&local_170);
    }
    Reference::~Reference(&local_170);
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<Reference> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  Reference v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}